

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_interface.h
# Opt level: O2

void __thiscall
cppcms::cache_interface::store_data<mydata>
          (cache_interface *this,string *key,mydata *data,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *triggers,int timeout,bool notriggers)

{
  string buffer;
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  serialization_traits<mydata,_void>::save((serializable_base *)data,&local_48);
  cppcms::cache_interface::store
            ((string *)this,(string *)key,(set *)&local_48,(int)triggers,SUB41(timeout,0));
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void store_data(std::string const &key,Serializable const &data,
				std::set<std::string> const &triggers=std::set<std::string>(),
				int timeout=-1,bool notriggers=false)
		{
			std::string buffer;
			serialization_traits<Serializable>::save(data,buffer);
			store(key,buffer,triggers,timeout,notriggers);
		}